

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeBuilder.cpp
# Opt level: O0

Shape * OpenMD::ShapeBuilder::internalCreateShape(Atom *atom)

{
  bool bVar1;
  int iVar2;
  Shape *pSVar3;
  Atom *in_RDI;
  iterator i;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  int obanum;
  LennardJonesAdapter lja;
  Shape *currShape;
  AtomType *atomType;
  AtomType *in_stack_fffffffffffffeb8;
  ElementsTable *in_stack_fffffffffffffec0;
  errorStruct *peVar4;
  ElementsTable *in_stack_fffffffffffffec8;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *in_stack_fffffffffffffed0;
  Vector3d *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string local_f8 [48];
  AtomType *in_stack_ffffffffffffff38;
  string local_c0 [32];
  AtomType **local_a0;
  AtomType **local_98;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_90 [4];
  int local_6c;
  string local_68 [72];
  LennardJonesAdapter local_20;
  Shape *local_18;
  AtomType *local_10;
  Atom *local_8;
  
  local_8 = in_RDI;
  local_10 = Atom::getAtomType(in_RDI);
  local_18 = (Shape *)0x0;
  LennardJonesAdapter::LennardJonesAdapter(&local_20,local_10);
  bVar1 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x207462);
  if (bVar1) {
    pSVar3 = (Shape *)operator_new(0x48);
    StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffec8);
    LennardJonesAdapter::getSigma((LennardJonesAdapter *)in_stack_fffffffffffffed0);
    Sphere::Sphere((Sphere *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8,(RealType)in_stack_fffffffffffffed0);
    local_18 = pSVar3;
    (*(local_8->super_StuntDouble)._vptr_StuntDouble[7])();
    Shape::setName((Shape *)in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_68);
  }
  else {
    local_6c = 0;
    AtomType::allYourBase(in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(local_90);
    local_98 = (AtomType **)
               std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                         ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                          in_stack_fffffffffffffeb8);
    local_90[0]._M_current = local_98;
    while( true ) {
      local_a0 = (AtomType **)
                 std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                           ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                            in_stack_fffffffffffffeb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffec0,
                         (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffeb8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
      ::operator*(local_90);
      AtomType::getName_abi_cxx11_(in_stack_fffffffffffffeb8);
      std::__cxx11::string::c_str();
      iVar2 = ElementsTable::GetAtomicNum
                        (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      local_6c = iVar2;
      std::__cxx11::string::~string(local_c0);
      if (local_6c != 0) {
        pSVar3 = (Shape *)operator_new(0x48);
        StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffec8);
        in_stack_fffffffffffffed0 =
             (vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
             ElementsTable::GetVdwRad
                       (in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        Sphere::Sphere((Sphere *)CONCAT44(iVar2,in_stack_fffffffffffffee0),(Vector3d *)pSVar3,
                       (RealType)in_stack_fffffffffffffed0);
        local_18 = pSVar3;
        (*(local_8->super_StuntDouble)._vptr_StuntDouble[7])(local_f8);
        Shape::setName((Shape *)in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(local_f8);
        break;
      }
      __gnu_cxx::
      __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
      ::operator++(local_90);
    }
    if (local_6c == 0) {
      peVar4 = &painCave;
      snprintf(painCave.errMsg,2000,"Could not find atom type in default element.txt\n");
      peVar4->severity = 1;
      peVar4->isFatal = 1;
      simError();
    }
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              (in_stack_fffffffffffffed0);
  }
  return local_18;
}

Assistant:

Shape* ShapeBuilder::internalCreateShape(Atom* atom) {
    AtomType* atomType      = atom->getAtomType();
    Shape* currShape        = NULL;
    LennardJonesAdapter lja = LennardJonesAdapter(atomType);
    if (lja.isLennardJones()) {
      currShape = new Sphere(atom->getPos(), lja.getSigma() / 2.0);
      currShape->setName(atom->getType());
    } else {
      int obanum(0);
      std::vector<AtomType*> atChain = atomType->allYourBase();
      std::vector<AtomType*>::iterator i;
      for (i = atChain.begin(); i != atChain.end(); ++i) {
        obanum = etab.GetAtomicNum((*i)->getName().c_str());
        if (obanum != 0) {
          currShape = new Sphere(atom->getPos(), etab.GetVdwRad(obanum));
          currShape->setName(atom->getType());
          break;
        }
      }
      if (obanum == 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not find atom type in default element.txt\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return currShape;
  }